

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocate.hpp
# Opt level: O3

void __thiscall
boost::unordered::detail::
node_tmp<std::allocator<boost::unordered::detail::ptr_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::variant<spartsi::node,_spartsi::ref_node>_>_>_>_>
::~node_tmp(node_tmp<std::allocator<boost::unordered::detail::ptr_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::variant<spartsi::node,_spartsi::ref_node>_>_>_>_>
            *this)

{
  node_pointer ppVar1;
  type tVar2;
  
  ppVar1 = this->node_;
  if (ppVar1 != (node_pointer)0x0) {
    variant<spartsi::node,_spartsi::ref_node>::destroy_content
              ((variant<spartsi::node,_spartsi::ref_node> *)
               ((long)&(ppVar1->value_base_).data_.data_ + 0x20));
    tVar2 = (ppVar1->value_base_).data_.data_.align_;
    if (tVar2 != (type)((long)&(ppVar1->value_base_).data_.data_ + 0x10)) {
      operator_delete((void *)tVar2);
    }
    operator_delete(this->node_);
    return;
  }
  return;
}

Assistant:

node_tmp<Alloc>::~node_tmp()
    {
        if (node_) {
            boost::unordered::detail::func::call_destroy(alloc_,
                node_->value_ptr());
            boost::unordered::detail::func::destroy(
                boost::addressof(*node_));
            node_allocator_traits::deallocate(alloc_, node_, 1);
        }
    }